

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat_solver.cpp
# Opt level: O0

void __thiscall Satyricon::SATSolver::reduce_learned(SATSolver *this)

{
  double dVar1;
  value_type pCVar2;
  uint uVar3;
  size_type sVar4;
  iterator iVar5;
  iterator iVar6;
  size_type sVar7;
  reference ppCVar8;
  uint64_t uVar9;
  Literal *pLVar10;
  double *pdVar11;
  undefined1 auVar12 [16];
  double extra_lim;
  size_t j;
  size_t i;
  SATSolver *this_local;
  
  j = 0;
  extra_lim = 0.0;
  dVar1 = (this->param).clause_activity_update;
  sVar4 = std::vector<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>::size
                    (&this->learned);
  auVar12._8_4_ = (int)(sVar4 >> 0x20);
  auVar12._0_8_ = sVar4;
  auVar12._12_4_ = 0x45300000;
  iVar5 = std::vector<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>::begin
                    (&this->learned);
  iVar6 = std::vector<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>::end
                    (&this->learned);
  std::
  sort<__gnu_cxx::__normal_iterator<Satyricon::Clause**,std::vector<Satyricon::Clause*,std::allocator<Satyricon::Clause*>>>,Satyricon::SATSolver::reduce_learned()::__0>
            (iVar5._M_current,iVar6._M_current);
  for (; sVar7 = std::vector<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>::size
                           (&this->learned), j < sVar7 >> 1; j = j + 1) {
    ppCVar8 = std::vector<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>::operator[]
                        (&this->learned,j);
    uVar9 = Clause::size(*ppCVar8);
    if (uVar9 == 2) {
LAB_0013d1db:
      ppCVar8 = std::vector<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>::operator[]
                          (&this->learned,j);
      pCVar2 = *ppCVar8;
      ppCVar8 = std::vector<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>::operator[]
                          (&this->learned,(size_type)extra_lim);
      *ppCVar8 = pCVar2;
      extra_lim = (double)((long)extra_lim + 1);
    }
    else {
      ppCVar8 = std::vector<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>::operator[]
                          (&this->learned,j);
      pLVar10 = Clause::at(*ppCVar8,0);
      uVar3 = Literal::var(pLVar10);
      ppCVar8 = std::vector<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>::operator[]
                          (&this->antecedents,(ulong)uVar3);
      pCVar2 = *ppCVar8;
      ppCVar8 = std::vector<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>::operator[]
                          (&this->learned,j);
      if (pCVar2 == *ppCVar8) goto LAB_0013d1db;
      ppCVar8 = std::vector<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>::operator[]
                          (&this->learned,j);
      remove_clause(this,*ppCVar8);
    }
  }
  do {
    sVar7 = std::vector<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>::size
                      (&this->learned);
    if (sVar7 <= j) {
      std::vector<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>::resize
                (&this->learned,(size_type)extra_lim);
      return;
    }
    ppCVar8 = std::vector<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>::operator[]
                        (&this->learned,j);
    uVar9 = Clause::size(*ppCVar8);
    if (uVar9 == 2) {
LAB_0013d319:
      ppCVar8 = std::vector<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>::operator[]
                          (&this->learned,j);
      pCVar2 = *ppCVar8;
      ppCVar8 = std::vector<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>::operator[]
                          (&this->learned,(size_type)extra_lim);
      *ppCVar8 = pCVar2;
      extra_lim = (double)((long)extra_lim + 1);
    }
    else {
      ppCVar8 = std::vector<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>::operator[]
                          (&this->learned,j);
      pLVar10 = Clause::at(*ppCVar8,0);
      uVar3 = Literal::var(pLVar10);
      ppCVar8 = std::vector<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>::operator[]
                          (&this->antecedents,(ulong)uVar3);
      pCVar2 = *ppCVar8;
      ppCVar8 = std::vector<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>::operator[]
                          (&this->learned,j);
      if (pCVar2 == *ppCVar8) goto LAB_0013d319;
      ppCVar8 = std::vector<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>::operator[]
                          (&this->learned,j);
      pdVar11 = Clause::get_activity(*ppCVar8);
      if (dVar1 / ((auVar12._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) <= *pdVar11)
      goto LAB_0013d319;
      ppCVar8 = std::vector<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>::operator[]
                          (&this->learned,j);
      remove_clause(this,*ppCVar8);
    }
    j = j + 1;
  } while( true );
}

Assistant:

void SATSolver::reduce_learned() {
    size_t i = 0, j = 0; // use this indices to compact the vector
    // Remove any clause below this activity
    double  extra_lim = param.clause_activity_update / learned.size();

    // sort learned clause by activity (in ascending order)
    sort(learned.begin(), learned.end(),
            [&](const ClausePtr& l, const ClausePtr& r)
                { return l->get_activity() < r->get_activity(); });

    // remove the first half
    for ( ; i < learned.size()/2 ; ++i ) {
        // keep a clause if is the antecedent of an asignment
        if ( learned[i]->size() == 2 || 
                antecedents[learned[i]->at(0).var()] == learned[i] )
            learned[j++] = learned[i]; // keep the justification
        else
            remove_clause(learned[i]);
    }

    // move the second half in the first half (this effectively delete the
    // low activity clauses)
    for (; i < learned.size(); ++i) {
        // keep a clause if is the antecedent of an asignment
        if ( learned[i]->size() == 2 || 
                antecedents[learned[i]->at(0).var()] == learned[i] ||
                learned[i]->get_activity() >= extra_lim )
            learned[j++] = learned[i]; // keep the justification
        else
            remove_clause(learned[i]);
    }

    // keep only the most active clause
    learned.resize( j );
}